

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswSat.c
# Opt level: O0

int Ssw_NodeIsConstrained(Ssw_Man_t *p,Aig_Obj_t *pPoObj)

{
  Ssw_Sat_t *pSVar1;
  int v;
  int iVar2;
  Aig_Obj_t *pAVar3;
  lit local_20;
  int local_1c;
  int Lit;
  int RetValue;
  Aig_Obj_t *pPoObj_local;
  Ssw_Man_t *p_local;
  
  pSVar1 = p->pMSat;
  _Lit = pPoObj;
  pPoObj_local = (Aig_Obj_t *)p;
  pAVar3 = Aig_ObjFanin0(pPoObj);
  Ssw_CnfNodeAddToSolver(pSVar1,pAVar3);
  pSVar1 = (Ssw_Sat_t *)pPoObj_local[1].pFanin1;
  pAVar3 = Aig_ObjFanin0(_Lit);
  v = Ssw_ObjSatNum(pSVar1,pAVar3);
  iVar2 = Aig_ObjFaninC0(_Lit);
  local_20 = toLitCond(v,(uint)((iVar2 != 0 ^ 0xffU) & 1));
  if ((*(int *)((long)&(pPoObj_local->field_0).pNext[1].pFanin0 + 4) != 0) &&
     (pAVar3 = Aig_ObjFanin0(_Lit), (*(ulong *)&pAVar3->field_0x18 >> 3 & 1) != 0)) {
    local_20 = lit_neg(local_20);
  }
  local_1c = sat_solver_addclause
                       ((sat_solver *)(pPoObj_local[1].pFanin1)->pFanin1,&local_20,&local_1c);
  if (local_1c == 0) {
    __assert_fail("RetValue",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssw/sswSat.c"
                  ,0x129,"int Ssw_NodeIsConstrained(Ssw_Man_t *, Aig_Obj_t *)");
  }
  return 1;
}

Assistant:

int Ssw_NodeIsConstrained( Ssw_Man_t * p, Aig_Obj_t * pPoObj )
{
    int RetValue, Lit;
    Ssw_CnfNodeAddToSolver( p->pMSat, Aig_ObjFanin0(pPoObj) );
    // add constraint A = 1  ---->  A
    Lit = toLitCond( Ssw_ObjSatNum(p->pMSat,Aig_ObjFanin0(pPoObj)), !Aig_ObjFaninC0(pPoObj) );
    if ( p->pPars->fPolarFlip )
    {
        if ( Aig_ObjFanin0(pPoObj)->fPhase )  Lit = lit_neg( Lit );
    }
    RetValue = sat_solver_addclause( p->pMSat->pSat, &Lit, &Lit + 1 );
    assert( RetValue );
    return 1;
}